

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clara.h
# Opt level: O0

vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> * __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::parseInto
          (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
           *__return_storage_ptr__,CommandLine<Catch::ConfigData> *this,int argc,char **argv,
          ConfigData *config)

{
  char *pcVar1;
  long lVar2;
  undefined1 local_c8 [8];
  Parser parser;
  vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> tokens;
  size_t lastSlash;
  allocator local_51;
  string local_50 [8];
  string processName;
  ConfigData *config_local;
  char **argv_local;
  int argc_local;
  CommandLine<Catch::ConfigData> *this_local;
  
  pcVar1 = *argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,&local_51);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  lVar2 = std::__cxx11::string::find_last_of((char *)local_50,0x1d589c);
  if (lVar2 != -1) {
    std::__cxx11::string::substr
              ((ulong)&tokens.
                       super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_50);
    std::__cxx11::string::operator=
              (local_50,(string *)
                        &tokens.
                         super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &tokens.
                super__Vector_base<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  Detail::BoundArgFunction<Catch::ConfigData>::set
            (&this->m_boundProcessName,config,(string *)local_50);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &parser.field_0x18);
  Parser::Parser((Parser *)local_c8);
  Parser::parseIntoTokens
            ((Parser *)local_c8,argc,argv,
             (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &parser.field_0x18);
  populate(__return_storage_ptr__,this,
           (vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
           &parser.field_0x18,config);
  Parser::~Parser((Parser *)local_c8);
  std::vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_>::~vector
            ((vector<Catch::Clara::Parser::Token,_std::allocator<Catch::Clara::Parser::Token>_> *)
             &parser.field_0x18);
  std::__cxx11::string::~string(local_50);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Parser::Token> parseInto( int argc, char const * const * argv, ConfigT& config ) const {
            std::string processName = argv[0];
            std::size_t lastSlash = processName.find_last_of( "/\\" );
            if( lastSlash != std::string::npos )
                processName = processName.substr( lastSlash+1 );
            m_boundProcessName.set( config, processName );
            std::vector<Parser::Token> tokens;
            Parser parser;
            parser.parseIntoTokens( argc, argv, tokens );
            return populate( tokens, config );
        }